

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::rebalance(Patch *this)

{
  uint32_t uVar1;
  Node *pivot;
  __type_conflict _Var2;
  double __y;
  uint local_38;
  uint32_t m;
  uint32_t n;
  Node *right;
  Node *left;
  Node *pseudo_root_parent;
  Node *pseudo_root;
  Patch *this_local;
  
  if (this->root != (Node *)0x0) {
    left = (Node *)0x0;
    pseudo_root_parent = this->root;
    while (pseudo_root_parent != (Node *)0x0) {
      pivot = pseudo_root_parent->left;
      if (pivot == (Node *)0x0) {
        left = pseudo_root_parent;
        pseudo_root_parent = pseudo_root_parent->right;
      }
      else {
        rotate_node_right(this,pivot,pseudo_root_parent,left);
        pseudo_root_parent = pivot;
      }
    }
    uVar1 = this->change_count;
    _Var2 = std::log2<unsigned_int>(uVar1 + 1);
    __y = floor(_Var2);
    _Var2 = std::pow<int,double>(2,__y);
    local_38 = (uint)(long)(_Var2 + -1.0);
    perform_rebalancing_rotations(this,uVar1 - local_38);
    while (1 < local_38) {
      local_38 = local_38 >> 1;
      perform_rebalancing_rotations(this,local_38);
    }
  }
  return;
}

Assistant:

void Patch::rebalance() {
  if (!root)
    return;

  // Transform tree to vine
  Node *pseudo_root = root, *pseudo_root_parent = nullptr;
  while (pseudo_root) {
    Node *left = pseudo_root->left;
    Node *right = pseudo_root->right;
    if (left) {
      rotate_node_right(left, pseudo_root, pseudo_root_parent);
      pseudo_root = left;
    } else {
      pseudo_root_parent = pseudo_root;
      pseudo_root = right;
    }
  }

  // Transform vine to balanced tree
  uint32_t n = change_count;
  uint32_t m = std::pow(2, std::floor(std::log2(n + 1))) - 1;
  perform_rebalancing_rotations(n - m);
  while (m > 1) {
    m = m / 2;
    perform_rebalancing_rotations(m);
  }
}